

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_free_message_pipe(JSWorkerMessagePipe *ps)

{
  int iVar1;
  int *in_RDI;
  int ref_count;
  JSWorkerMessage *msg;
  list_head *el1;
  list_head *el;
  JSWorkerMessage *local_18;
  JSWorkerMessage *local_10;
  
  if ((in_RDI != (int *)0x0) && (iVar1 = atomic_add_int(in_RDI,-1), iVar1 == 0)) {
    local_10 = *(JSWorkerMessage **)(in_RDI + 0xe);
    local_18 = (JSWorkerMessage *)(local_10->link).next;
    while (local_10 != (JSWorkerMessage *)(in_RDI + 0xc)) {
      js_free_message(local_10);
      local_10 = local_18;
      local_18 = (JSWorkerMessage *)(local_18->link).next;
    }
    pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 2));
    close(in_RDI[0x10]);
    close(in_RDI[0x11]);
    free(in_RDI);
  }
  return;
}

Assistant:

static void js_free_message_pipe(JSWorkerMessagePipe *ps)
{
    struct list_head *el, *el1;
    JSWorkerMessage *msg;
    int ref_count;
    
    if (!ps)
        return;
    
    ref_count = atomic_add_int(&ps->ref_count, -1);
    assert(ref_count >= 0);
    if (ref_count == 0) {
        list_for_each_safe(el, el1, &ps->msg_queue) {
            msg = list_entry(el, JSWorkerMessage, link);
            js_free_message(msg);
        }
        pthread_mutex_destroy(&ps->mutex);
        close(ps->read_fd);
        close(ps->write_fd);
        free(ps);
    }
}